

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

void lodepng::convertFromXYZ_gamma
               (float *im,uint w,uint h,LodePNGInfo *info,uint use_icc,LodePNGICC *icc)

{
  ulong uVar1;
  float *pfVar2;
  LodePNGICCCurve *in_RCX;
  float in_EDX;
  int in_ESI;
  long in_RDI;
  float in_R8D;
  float fVar3;
  float *v;
  float gamma;
  size_t n;
  size_t c;
  size_t i;
  float local_54;
  ulong local_38;
  ulong local_30;
  
  uVar1 = (ulong)(uint)(in_ESI * (int)in_EDX);
  if (in_R8D == 0.0) {
    if ((*(int *)((long)&in_RCX[3].lut + 4) == 0) || (in_RCX[4].type != 0)) {
      for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
        for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
          pfVar2 = (float *)(in_RDI + (local_30 * 4 + local_38) * 4);
          if (0.0031308 < *pfVar2 || *pfVar2 == 0.0031308) {
            fVar3 = lodepng_powf(in_EDX,(float)((ulong)in_RCX >> 0x20));
            local_54 = fVar3 * 1.055 + -0.055;
          }
          else {
            local_54 = *pfVar2 * 12.92;
          }
          *pfVar2 = local_54;
        }
      }
    }
    else if ((int)in_RCX[3].lut_size != 100000) {
      for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
        for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
          if (0.0 < *(float *)(in_RDI + (local_30 * 4 + local_38) * 4)) {
            fVar3 = lodepng_powf(in_EDX,(float)((ulong)in_RCX >> 0x20));
            *(float *)(in_RDI + (local_30 * 4 + local_38) * 4) = fVar3;
          }
        }
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
      for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
        fVar3 = iccBackwardTRC(in_RCX,in_R8D);
        *(float *)(in_RDI + (local_30 * 4 + local_38) * 4) = fVar3;
      }
    }
  }
  return;
}

Assistant:

static void convertFromXYZ_gamma(float* im, unsigned w, unsigned h,
                                 const LodePNGInfo* info, unsigned use_icc, const LodePNGICC* icc) {
  size_t i, c;
  size_t n = w * h;
  if(use_icc) {
    for(i = 0; i < n; i++) {
      for(c = 0; c < 3; c++) {
        /* TODO: this is likely very slow */
        im[i * 4 + c] = iccBackwardTRC(&icc->trc[c], im[i * 4 + c]);
      }
    }
  } else if(info->gama_defined && !info->srgb_defined) {
    /* nothing to do if gamma is 1 */
    if(info->gama_gamma != 100000) {
      float gamma = info->gama_gamma / 100000.0f;
      for(i = 0; i < n; i++) {
        for(c = 0; c < 3; c++) {
          if(im[i * 4 + c] > 0) im[i * 4 + c] = lodepng_powf(im[i * 4 + c], gamma);
        }
      }
    }
  } else {
    for(i = 0; i < n; i++) {
      for(c = 0; c < 3; c++) {
        /* sRGB gamma compress */
        float* v = &im[i * 4 + c];
        *v = (*v < 0.0031308f) ? (*v * 12.92f) : (1.055f * lodepng_powf(*v, 1 / 2.4f) - 0.055f);
      }
    }
  }
}